

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestSubmitHandler::SubmitUsingHTTP
          (cmCTestSubmitHandler *this,string *localprefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *remoteprefix,string *url)

{
  cmCTest *pcVar1;
  pointer pcVar2;
  cmState *this_00;
  char cVar3;
  string *psVar4;
  bool bVar5;
  int iVar6;
  CURLcode CVar7;
  int iVar8;
  ostream *poVar9;
  CURL_conflict *data;
  long *plVar10;
  cmCTestScriptHandler *pcVar11;
  char *pcVar12;
  size_t sVar13;
  unsigned_long uVar14;
  pointer pcVar15;
  char *pcVar16;
  long lVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  size_type *psVar19;
  long *plVar20;
  undefined8 uVar21;
  string *arg;
  pointer pbVar22;
  pointer pbVar23;
  byte bVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  byte bVar27;
  ulong uVar28;
  string retryDelay;
  string remote_file;
  string retryCount;
  string local_file;
  cmCTestSubmitHandlerVectorOfChar chunk;
  string upload_as;
  cmCTestSubmitHandlerVectorOfChar chunkDebug;
  ostringstream cmCTestLog_msg;
  string curlopt;
  string ofile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char error_buffer [1024];
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  void *local_758;
  void *pvStack_750;
  long local_748;
  long *local_738;
  long local_730;
  long local_728;
  long lStack_720;
  pointer local_718;
  curl_slist *local_710;
  Curl_easy *local_708;
  FILE *local_700;
  void *local_6f8;
  void *pvStack_6f0;
  long local_6e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_6e0;
  uint local_6d8;
  uint uStack_6d4;
  undefined1 local_6d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c0 [6];
  ios_base local_660 [264];
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string *local_4d8;
  string *local_4d0;
  string *local_4c8;
  pointer local_4c0;
  double local_4b8;
  double local_4b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4a8;
  cmCTestSubmitHandlerVectorOfChar local_488;
  cmCTestSubmitHandlerVectorOfChar local_470;
  string local_458;
  char local_438 [1032];
  uint uVar25;
  
  local_6e0 = files;
  local_4d8 = localprefix;
  local_4d0 = url;
  local_4c8 = remoteprefix;
  local_710 = curl_slist_append((curl_slist *)0x0,"Content-Type: text/xml");
  pbVar22 = (this->HttpHeaders).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar23 = (this->HttpHeaders).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar22 != pbVar23) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_6d0,"   Add HTTP Header: \"",0x15);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_6d0,(pbVar22->_M_dataplus)._M_p,pbVar22->_M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x96,local_558._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_dataplus._M_p != &local_558.field_2) {
        operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d0);
      std::ios_base::~ios_base(local_660);
      local_710 = curl_slist_append(local_710,(pbVar22->_M_dataplus)._M_p);
      pbVar22 = pbVar22 + 1;
    } while (pbVar22 != pbVar23);
  }
  curl_global_init(3);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_6d0._0_8_ = local_6c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d0,"CurlOptions","");
  cmCTest::GetCTestConfiguration(&local_558,pcVar1,(string *)local_6d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._0_8_ != local_6c0) {
    operator_delete((void *)local_6d0._0_8_,local_6c0[0]._M_allocated_capacity + 1);
  }
  local_4a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmSystemTools::ExpandListArgument(&local_558,&local_4a8,false);
  pbVar22 = local_4a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_4a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_4a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_6d8 = 0;
    uVar25 = 0;
  }
  else {
    bVar24 = 0;
    bVar27 = 0;
    pbVar23 = local_4a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar6 = std::__cxx11::string::compare((char *)pbVar23);
      bVar24 = bVar24 | iVar6 == 0;
      uVar25 = (uint)bVar24;
      iVar6 = std::__cxx11::string::compare((char *)pbVar23);
      bVar27 = bVar27 | iVar6 == 0;
      local_6d8 = (uint)bVar27;
      pbVar23 = pbVar23 + 1;
    } while (pbVar23 != pbVar22);
  }
  local_718 = (local_6e0->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_4c0 = (local_6e0->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  uStack_6d4 = uVar25;
  if (local_718 != local_4c0) {
    do {
      paVar26 = &local_7b8.field_2;
      data = curl_easy_init();
      if (data != (CURL_conflict *)0x0) {
        cmCurlSetCAInfo_abi_cxx11_(&local_458,data,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
        }
        if ((uStack_6d4 & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_6d0,"  Set CURLOPT_SSL_VERIFYPEER to off\n",0x24);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0xb1,local_778._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_778._M_dataplus._M_p != &local_778.field_2) {
            operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d0);
          std::ios_base::~ios_base(local_660);
          curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
        }
        if ((local_6d8 & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_6d0,"  Set CURLOPT_SSL_VERIFYHOST to off\n",0x24);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0xb7,local_778._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_778._M_dataplus._M_p != &local_778.field_2) {
            operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d0);
          std::ios_base::~ios_base(local_660);
          curl_easy_setopt(data,CURLOPT_SSL_VERIFYHOST,0);
        }
        if (0 < this->HTTPProxyType) {
          curl_easy_setopt(data,CURLOPT_PROXY,(this->HTTPProxy)._M_dataplus._M_p);
          if (this->HTTPProxyType == 2) {
            uVar21 = 4;
          }
          else {
            if (this->HTTPProxyType != 3) {
              curl_easy_setopt(data,CURLOPT_PROXYTYPE,0);
              if ((this->HTTPProxyAuth)._M_string_length != 0) {
                curl_easy_setopt(data,CURLOPT_PROXYUSERPWD,(this->HTTPProxyAuth)._M_dataplus._M_p);
              }
              goto LAB_0019fb17;
            }
            uVar21 = 5;
          }
          curl_easy_setopt(data,CURLOPT_PROXYTYPE,uVar21);
        }
LAB_0019fb17:
        bVar5 = cmCTest::ShouldUseHTTP10((this->super_cmCTestGenericHandler).CTest);
        if (bVar5) {
          curl_easy_setopt(data,CURLOPT_HTTP_VERSION,1);
        }
        curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
        curl_easy_setopt(data,CURLOPT_UPLOAD,1);
        curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
        curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,0x78);
        curl_easy_setopt(data,CURLOPT_PUT,1);
        curl_easy_setopt(data,CURLOPT_VERBOSE,1);
        curl_easy_setopt(data,CURLOPT_HTTPHEADER,local_710);
        local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
        pcVar2 = (local_718->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_778,pcVar2,pcVar2 + local_718->_M_string_length);
        bVar5 = cmsys::SystemTools::FileExists(&local_778);
        if (!bVar5) {
          pcVar2 = (local_4d8->_M_dataplus)._M_p;
          local_7b8._M_dataplus._M_p = (pointer)paVar26;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_7b8,pcVar2,pcVar2 + local_4d8->_M_string_length);
          std::__cxx11::string::append((char *)&local_7b8);
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_7b8,(ulong)(local_718->_M_dataplus)._M_p);
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 == paVar18) {
            local_6c0[0]._0_8_ = paVar18->_M_allocated_capacity;
            local_6c0[0]._8_8_ = plVar10[3];
            local_6d0._0_8_ = local_6c0;
          }
          else {
            local_6c0[0]._0_8_ = paVar18->_M_allocated_capacity;
            local_6d0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar10;
          }
          local_6d0._8_8_ = plVar10[1];
          *plVar10 = (long)paVar18;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_778,(string *)local_6d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6d0._0_8_ != local_6c0) {
            operator_delete((void *)local_6d0._0_8_,local_6c0[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7b8._M_dataplus._M_p != paVar26) {
            operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
          }
        }
        cmsys::SystemTools::GetFilenameName((string *)local_6d0,local_718);
        plVar10 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_6d0,0,(char *)0x0,
                                     (ulong)(local_4c8->_M_dataplus)._M_p);
        psVar19 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_7b8.field_2._M_allocated_capacity = *psVar19;
          local_7b8.field_2._8_8_ = plVar10[3];
          local_7b8._M_dataplus._M_p = (pointer)paVar26;
        }
        else {
          local_7b8.field_2._M_allocated_capacity = *psVar19;
          local_7b8._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_7b8._M_string_length = plVar10[1];
        *plVar10 = (long)psVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d0._0_8_ != local_6c0) {
          operator_delete((void *)local_6d0._0_8_,local_6c0[0]._M_allocated_capacity + 1);
        }
        poVar9 = this->LogFile;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\tUpload file: ",0xe);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_778._M_dataplus._M_p,local_778._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," to ",4);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_7b8._M_dataplus._M_p,local_7b8._M_string_length);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        cmSystemTools::EncodeURL(&local_538,&local_7b8,true);
        psVar4 = local_4d0;
        std::__cxx11::string::find((char)local_4d0,0x3f);
        local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
        pcVar2 = (psVar4->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7f8,pcVar2,pcVar2 + psVar4->_M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)&local_7f8,local_7f8._M_string_length,0,'\x01');
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_7f8);
        local_6d0._0_8_ = local_6c0;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 == paVar18) {
          local_6c0[0]._0_8_ = paVar18->_M_allocated_capacity;
          local_6c0[0]._8_8_ = plVar10[3];
        }
        else {
          local_6c0[0]._0_8_ = paVar18->_M_allocated_capacity;
          local_6d0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar10;
        }
        local_6d0._8_8_ = plVar10[1];
        *plVar10 = (long)paVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    (local_6d0,(ulong)local_538._M_dataplus._M_p);
        local_738 = &local_728;
        plVar20 = plVar10 + 2;
        if ((long *)*plVar10 == plVar20) {
          local_728 = *plVar20;
          lStack_720 = plVar10[3];
        }
        else {
          local_728 = *plVar20;
          local_738 = (long *)*plVar10;
        }
        local_730 = plVar10[1];
        *plVar10 = (long)plVar20;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d0._0_8_ != local_6c0) {
          operator_delete((void *)local_6d0._0_8_,local_6c0[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
          operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
        }
        if (!bVar5) {
          cmCTestCurl::cmCTestCurl
                    ((cmCTestCurl *)local_6d0,(this->super_cmCTestGenericHandler).CTest);
          std::__cxx11::string::append((char *)&local_738);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"BuildName","");
          cmCTest::GetCTestConfiguration(&local_798,pcVar1,&local_7d8);
          cmCTestCurl::Escape(&local_7f8,(cmCTestCurl *)local_6d0,&local_798);
          std::__cxx11::string::_M_append((char *)&local_738,(ulong)local_7f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
            operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_798._M_dataplus._M_p != &local_798.field_2) {
            operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
            operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_738);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"Site","");
          cmCTest::GetCTestConfiguration(&local_798,pcVar1,&local_7d8);
          cmCTestCurl::Escape(&local_7f8,(cmCTestCurl *)local_6d0,&local_798);
          std::__cxx11::string::_M_append((char *)&local_738,(ulong)local_7f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
            operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_798._M_dataplus._M_p != &local_798.field_2) {
            operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
            operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_738);
          cmCTest::GetCurrentTag_abi_cxx11_(&local_798,(this->super_cmCTestGenericHandler).CTest);
          cmCTestCurl::Escape(&local_7f8,(cmCTestCurl *)local_6d0,&local_798);
          std::__cxx11::string::_M_append((char *)&local_738,(ulong)local_7f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
            operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_798._M_dataplus._M_p != &local_798.field_2) {
            operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_738);
          cmCTest::GetTestModelString_abi_cxx11_
                    (&local_798,(this->super_cmCTestGenericHandler).CTest);
          cmCTestCurl::Escape(&local_7f8,(cmCTestCurl *)local_6d0,&local_798);
          std::__cxx11::string::_M_append((char *)&local_738,(ulong)local_7f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
            operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_798._M_dataplus._M_p != &local_798.field_2) {
            operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
          }
          pcVar11 = cmCTest::GetScriptHandler((this->super_cmCTestGenericHandler).CTest);
          if (pcVar11->CMake != (cmake *)0x0) {
            this_00 = (pcVar11->CMake->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
            local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"SubProject","");
            pcVar12 = cmState::GetGlobalProperty(this_00,&local_7f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
              operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1
                             );
            }
            if (pcVar12 != (char *)0x0) {
              std::__cxx11::string::append((char *)&local_738);
              local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
              sVar13 = strlen(pcVar12);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_798,pcVar12,pcVar12 + sVar13);
              cmCTestCurl::Escape(&local_7f8,(cmCTestCurl *)local_6d0,&local_798);
              std::__cxx11::string::_M_append((char *)&local_738,(ulong)local_7f8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
                operator_delete(local_7f8._M_dataplus._M_p,
                                local_7f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_798._M_dataplus._M_p != &local_798.field_2) {
                operator_delete(local_798._M_dataplus._M_p,
                                local_798.field_2._M_allocated_capacity + 1);
              }
            }
          }
          cmCTestCurl::~cmCTestCurl((cmCTestCurl *)local_6d0);
        }
        std::__cxx11::string::append((char *)&local_738);
        local_6d0._0_8_ = local_6c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6d0,"InternalTest","");
        pcVar12 = cmCTestGenericHandler::GetOption
                            (&this->super_cmCTestGenericHandler,(string *)local_6d0);
        bVar5 = cmSystemTools::IsOn(pcVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d0._0_8_ != local_6c0) {
          operator_delete((void *)local_6d0._0_8_,local_6c0[0]._M_allocated_capacity + 1);
        }
        if (bVar5) {
          std::__cxx11::string::append((char *)&local_738);
        }
        else {
          cmSystemTools::ComputeFileHash((string *)local_6d0,&local_778,AlgoMD5);
          std::__cxx11::string::_M_append((char *)&local_738,local_6d0._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6d0._0_8_ != local_6c0) {
            operator_delete((void *)local_6d0._0_8_,local_6c0[0]._M_allocated_capacity + 1);
          }
        }
        iVar6 = std::__cxx11::string::compare((char *)local_718);
        if (iVar6 == 0) {
          cmCTest::GenerateDoneFile((this->super_cmCTestGenericHandler).CTest);
        }
        bVar5 = cmsys::SystemTools::FileExists(&local_778);
        if (bVar5) {
          uVar14 = cmsys::SystemTools::FileLength(&local_778);
          local_700 = (FILE *)cmsys::SystemTools::Fopen(&local_778,"rb");
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_6d0,"   Upload file: ",0x10);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_6d0,local_778._M_dataplus._M_p,
                              local_778._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," to ",4);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(char *)local_738,local_730);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," Size: ",7);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x130,local_7f8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
            operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d0);
          std::ios_base::~ios_base(local_660);
          curl_easy_setopt(data,CURLOPT_URL,local_738);
          curl_easy_setopt(data,CURLOPT_HTTPAUTH,0xffffffffffffffef);
          curl_easy_setopt(data,CURLOPT_READDATA,local_700);
          curl_easy_setopt(data,CURLOPT_INFILESIZE,uVar14);
          curl_easy_setopt(data,CURLOPT_ERRORBUFFER,local_438);
          curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,cmCTestSubmitHandlerWriteMemoryCallback);
          curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,cmCTestSubmitHandlerCurlDebugCallback);
          local_758 = (void *)0x0;
          pvStack_750 = (void *)0x0;
          local_748 = 0;
          local_6e8 = 0;
          local_6f8 = (void *)0x0;
          pvStack_6f0 = (void *)0x0;
          local_708 = data;
          curl_easy_setopt(data,CURLOPT_WRITEDATA,&local_758);
          curl_easy_setopt(local_708,CURLOPT_DEBUGDATA,&local_6f8);
          CVar7 = curl_easy_perform(local_708);
          if (local_758 != pvStack_750) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6d0,"CURL output: [",0xe);
            if (pvStack_750 != local_758) {
              std::ostream::write((char *)local_6d0,(long)local_758);
              std::ostream::flush();
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6d0,"]",1);
            cVar3 = (char)(ostream *)local_6d0;
            std::ios::widen((char)*(undefined8 *)(local_6d0._0_8_ + -0x18) + cVar3);
            std::ostream::put(cVar3);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x156,local_7f8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet
                        );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
              operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d0);
            std::ios_base::~ios_base(local_660);
            uVar28 = (long)pvStack_750 - (long)local_758;
            if (uVar28 == 0) {
              pcVar15 = (pointer)0x0;
              sVar13 = 0;
            }
            else {
              if ((long)uVar28 < 0) {
                std::__throw_bad_alloc();
              }
              pcVar15 = (pointer)operator_new(uVar28);
              sVar13 = (long)pvStack_750 - (long)local_758;
            }
            local_470.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = pcVar15 + uVar28;
            local_470.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = pcVar15;
            if (pvStack_750 != local_758) {
              memmove(pcVar15,local_758,sVar13);
            }
            local_470.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = pcVar15 + sVar13;
            ParseResponse(this,&local_470);
            if (pcVar15 != (pointer)0x0) {
              operator_delete(pcVar15,uVar28);
            }
          }
          if (local_6f8 != pvStack_6f0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6d0,"CURL debug output: [",0x14);
            if (pvStack_6f0 != local_6f8) {
              std::ostream::write((char *)local_6d0,(long)local_6f8);
              std::ostream::flush();
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6d0,"]",1);
            cVar3 = (char)(ostream *)local_6d0;
            std::ios::widen((char)*(undefined8 *)(local_6d0._0_8_ + -0x18) + cVar3);
            std::ostream::put(cVar3);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x15f,local_7f8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet
                        );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
              operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d0);
            std::ios_base::~ios_base(local_660);
          }
          if ((CVar7 == CURLE_OK) && (this->HasErrors == false)) {
            fclose(local_700);
LAB_001a16d4:
            curl_easy_cleanup(local_708);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d0);
            std::operator+(&local_7f8,"   Uploaded: ",&local_778);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_6d0,local_7f8._M_dataplus._M_p,
                                local_7f8._M_string_length);
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
              operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1
                             );
            }
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x1bd,local_7f8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet
                        );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
              operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d0);
            std::ios_base::~ios_base(local_660);
            bVar5 = true;
          }
          else {
            local_6d0._0_8_ = local_6c0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6d0,"RetryDelay","");
            pcVar12 = cmCTestGenericHandler::GetOption
                                (&this->super_cmCTestGenericHandler,(string *)local_6d0);
            pcVar16 = "";
            if (pcVar12 != (char *)0x0) {
              local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"RetryDelay","");
              pcVar16 = cmCTestGenericHandler::GetOption
                                  (&this->super_cmCTestGenericHandler,&local_4f8);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_7f8,pcVar16,(allocator<char> *)&local_798);
            if ((pcVar12 != (char *)0x0) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p != &local_4f8.field_2)) {
              operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6d0._0_8_ != local_6c0) {
              operator_delete((void *)local_6d0._0_8_,local_6c0[0]._M_allocated_capacity + 1);
            }
            local_6d0._0_8_ = local_6c0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6d0,"RetryCount","");
            pcVar12 = cmCTestGenericHandler::GetOption
                                (&this->super_cmCTestGenericHandler,(string *)local_6d0);
            pcVar16 = "";
            if (pcVar12 != (char *)0x0) {
              local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"RetryCount","");
              pcVar16 = cmCTestGenericHandler::GetOption
                                  (&this->super_cmCTestGenericHandler,&local_518);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_798,pcVar16,(allocator<char> *)&local_7d8);
            if ((pcVar12 != (char *)0x0) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_518._M_dataplus._M_p != &local_518.field_2)) {
              operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6d0._0_8_ != local_6c0) {
              operator_delete((void *)local_6d0._0_8_,local_6c0[0]._M_allocated_capacity + 1);
            }
            if (local_7f8._M_string_length == 0) {
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_7d8,"CTestSubmitRetryDelay","");
              cmCTest::GetCTestConfiguration((string *)local_6d0,pcVar1,&local_7d8);
              uVar21 = local_6d0._0_8_;
              iVar6 = atoi((char *)local_6d0._0_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uVar21 != local_6c0) {
                operator_delete((void *)uVar21,local_6c0[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
                operator_delete(local_7d8._M_dataplus._M_p,
                                local_7d8.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              iVar6 = atoi(local_7f8._M_dataplus._M_p);
            }
            if (local_798._M_string_length == 0) {
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_7d8,"CTestSubmitRetryCount","");
              cmCTest::GetCTestConfiguration((string *)local_6d0,pcVar1,&local_7d8);
              uVar21 = local_6d0._0_8_;
              iVar8 = atoi((char *)local_6d0._0_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uVar21 != local_6c0) {
                operator_delete((void *)uVar21,local_6c0[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
                operator_delete(local_7d8._M_dataplus._M_p,
                                local_7d8.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              iVar8 = atoi(local_798._M_dataplus._M_p);
            }
            if (0 < iVar8) {
              local_4b0 = (double)iVar6;
              local_4b8 = local_4b0 * 1000000000.0;
              iVar6 = 0;
              do {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_6d0,"   Submit failed, waiting ",0x1a);
                poVar9 = std::ostream::_M_insert<double>(local_4b0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," seconds...\n",0xc);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar1,2,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                             ,0x17a,local_7d8._M_dataplus._M_p,
                             (this->super_cmCTestGenericHandler).Quiet);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
                  operator_delete(local_7d8._M_dataplus._M_p,
                                  local_7d8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d0);
                std::ios_base::~ios_base(local_660);
                lVar17 = std::chrono::_V2::steady_clock::now();
                local_6e0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((double)lVar17 + local_4b8);
                while (lVar17 = std::chrono::_V2::steady_clock::now(),
                      (double)lVar17 < (double)local_6e0) {
                  cmsys::SystemTools::Delay(100);
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_6d0,"   Retry submission: Attempt ",0x1d);
                iVar6 = iVar6 + 1;
                poVar9 = (ostream *)std::ostream::operator<<(local_6d0,iVar6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," of ",4);
                plVar10 = (long *)std::ostream::operator<<(poVar9,iVar8);
                std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
                std::ostream::put((char)plVar10);
                std::ostream::flush();
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar1,2,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                             ,0x184,local_7d8._M_dataplus._M_p,
                             (this->super_cmCTestGenericHandler).Quiet);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
                  operator_delete(local_7d8._M_dataplus._M_p,
                                  local_7d8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d0);
                std::ios_base::~ios_base(local_660);
                fclose(local_700);
                local_700 = (FILE *)cmsys::SystemTools::Fopen(&local_778,"rb");
                curl_easy_setopt(local_708,CURLOPT_READDATA,local_700);
                if (pvStack_750 != local_758) {
                  pvStack_750 = local_758;
                }
                if (pvStack_6f0 != local_6f8) {
                  pvStack_6f0 = local_6f8;
                }
                this->HasErrors = false;
                CVar7 = curl_easy_perform(local_708);
                if (local_758 != pvStack_750) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_6d0,"CURL output: [",0xe);
                  if (pvStack_750 != local_758) {
                    std::ostream::write((char *)local_6d0,(long)local_758);
                    std::ostream::flush();
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6d0,"]",1);
                  cVar3 = (char)(ostream *)local_6d0;
                  std::ios::widen((char)*(undefined8 *)(local_6d0._0_8_ + -0x18) + cVar3);
                  std::ostream::put(cVar3);
                  std::ostream::flush();
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar1,0,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                               ,0x195,local_7d8._M_dataplus._M_p,
                               (this->super_cmCTestGenericHandler).Quiet);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
                    operator_delete(local_7d8._M_dataplus._M_p,
                                    local_7d8.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d0);
                  std::ios_base::~ios_base(local_660);
                  uVar28 = (long)pvStack_750 - (long)local_758;
                  if (uVar28 == 0) {
                    pcVar15 = (pointer)0x0;
                    sVar13 = 0;
                  }
                  else {
                    if ((long)uVar28 < 0) {
                      std::__throw_bad_alloc();
                    }
                    pcVar15 = (pointer)operator_new(uVar28);
                    sVar13 = (long)pvStack_750 - (long)local_758;
                  }
                  local_488.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = pcVar15 + uVar28;
                  local_488.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start = pcVar15;
                  if (pvStack_750 != local_758) {
                    memmove(pcVar15,local_758,sVar13);
                  }
                  local_488.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish = pcVar15 + sVar13;
                  ParseResponse(this,&local_488);
                  if (pcVar15 != (pointer)0x0) {
                    operator_delete(pcVar15,uVar28);
                  }
                }
                if ((CVar7 == CURLE_OK) && (this->HasErrors != true)) {
                  CVar7 = CURLE_OK;
                  break;
                }
              } while (iVar6 != iVar8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_798._M_dataplus._M_p != &local_798.field_2) {
              operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
              operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1
                             );
            }
            fclose(local_700);
            if (CVar7 == CURLE_OK) goto LAB_001a16d4;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6d0,"   Error when uploading file: ",0x1e);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_6d0,local_778._M_dataplus._M_p,
                                local_778._M_string_length);
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x1a3,local_7f8._M_dataplus._M_p,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
              operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d0);
            std::ios_base::~ios_base(local_660);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6d0,"   Error message was: ",0x16);
            sVar13 = strlen(local_438);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6d0,local_438,sVar13);
            cVar3 = (char)(ostringstream *)local_6d0;
            std::ios::widen((char)*(undefined8 *)(local_6d0._0_8_ + -0x18) + cVar3);
            std::ostream::put(cVar3);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x1a5,local_7f8._M_dataplus._M_p,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
              operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d0);
            std::ios_base::~ios_base(local_660);
            poVar9 = this->LogFile;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"   Error when uploading file: ",0x1e);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_778._M_dataplus._M_p,local_778._M_string_length);
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            poVar9 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   Error message was: ",0x16)
            ;
            sVar13 = strlen(local_438);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_438,sVar13);
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            if (local_758 != pvStack_750) {
              poVar9 = this->LogFile;
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   Curl output was: ",0x14)
              ;
              if (pvStack_750 != local_758) {
                std::ostream::write((char *)poVar9,(long)local_758);
                std::ostream::flush();
              }
              std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_6d0,"CURL output: [",0xe);
              if (pvStack_750 != local_758) {
                std::ostream::write((char *)local_6d0,(long)local_758);
                std::ostream::flush();
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6d0,"]",1);
              cVar3 = (char)(ostream *)local_6d0;
              std::ios::widen((char)*(undefined8 *)(local_6d0._0_8_ + -0x18) + cVar3);
              std::ostream::put(cVar3);
              std::ostream::flush();
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                           ,0x1b2,local_7f8._M_dataplus._M_p,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
                operator_delete(local_7f8._M_dataplus._M_p,
                                local_7f8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d0);
              std::ios_base::~ios_base(local_660);
            }
            curl_easy_cleanup(local_708);
            curl_slist_free_all(local_710);
            curl_global_cleanup();
            bVar5 = false;
          }
          if (local_6f8 != (void *)0x0) {
            operator_delete(local_6f8,local_6e8 - (long)local_6f8);
          }
          if (local_758 != (void *)0x0) {
            operator_delete(local_758,local_748 - (long)local_758);
          }
          if (local_738 != &local_728) {
            operator_delete(local_738,local_728 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
            operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_778._M_dataplus._M_p != &local_778.field_2) {
            operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
          }
          if (bVar5) goto LAB_001a18a9;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_6d0,"   Cannot find file: ",0x15);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_6d0,local_778._M_dataplus._M_p,
                              local_778._M_string_length);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x123,local_7f8._M_dataplus._M_p,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
            operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d0);
          std::ios_base::~ios_base(local_660);
          curl_easy_cleanup(data);
          curl_slist_free_all(local_710);
          curl_global_cleanup();
          if (local_738 != &local_728) {
            operator_delete(local_738,local_728 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7b8._M_dataplus._M_p != paVar26) {
            operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_778._M_dataplus._M_p != &local_778.field_2) {
            operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
          }
        }
        bVar5 = false;
        goto LAB_001a1a6c;
      }
LAB_001a18a9:
      local_718 = local_718 + 1;
    } while (local_718 != local_4c0);
  }
  curl_slist_free_all(local_710);
  bVar5 = true;
  curl_global_cleanup();
LAB_001a1a6c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool cmCTestSubmitHandler::SubmitUsingHTTP(
  const std::string& localprefix, const std::vector<std::string>& files,
  const std::string& remoteprefix, const std::string& url)
{
  CURL* curl;
  CURLcode res;
  FILE* ftpfile;
  char error_buffer[1024];
  // Set Content-Type to satisfy fussy modsecurity rules.
  struct curl_slist* headers =
    ::curl_slist_append(nullptr, "Content-Type: text/xml");

  // Add any additional headers that the user specified.
  for (std::string const& h : this->HttpHeaders) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "   Add HTTP Header: \"" << h << "\"" << std::endl,
                       this->Quiet);
    headers = ::curl_slist_append(headers, h.c_str());
  }

  /* In windows, this will init the winsock stuff */
  ::curl_global_init(CURL_GLOBAL_ALL);
  std::string curlopt(this->CTest->GetCTestConfiguration("CurlOptions"));
  std::vector<std::string> args;
  cmSystemTools::ExpandListArgument(curlopt, args);
  bool verifyPeerOff = false;
  bool verifyHostOff = false;
  for (std::string const& arg : args) {
    if (arg == "CURLOPT_SSL_VERIFYPEER_OFF") {
      verifyPeerOff = true;
    }
    if (arg == "CURLOPT_SSL_VERIFYHOST_OFF") {
      verifyHostOff = true;
    }
  }
  for (std::string const& file : files) {
    /* get a curl handle */
    curl = curl_easy_init();
    if (curl) {
      cmCurlSetCAInfo(curl);
      if (verifyPeerOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYPEER to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
      }
      if (verifyHostOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYHOST to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, 0);
      }

      // Using proxy
      if (this->HTTPProxyType > 0) {
        curl_easy_setopt(curl, CURLOPT_PROXY, this->HTTPProxy.c_str());
        switch (this->HTTPProxyType) {
          case 2:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS4);
            break;
          case 3:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS5);
            break;
          default:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);
            if (!this->HTTPProxyAuth.empty()) {
              curl_easy_setopt(curl, CURLOPT_PROXYUSERPWD,
                               this->HTTPProxyAuth.c_str());
            }
        }
      }
      if (this->CTest->ShouldUseHTTP10()) {
        curl_easy_setopt(curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_0);
      }
      // enable HTTP ERROR parsing
      curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
      /* enable uploading */
      curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);

      // if there is little to no activity for too long stop submitting
      ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
      ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME,
                         SUBMIT_TIMEOUT_IN_SECONDS_DEFAULT);

      /* HTTP PUT please */
      ::curl_easy_setopt(curl, CURLOPT_PUT, 1);
      ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);

      ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

      std::string local_file = file;
      bool initialize_cdash_buildid = false;
      if (!cmSystemTools::FileExists(local_file)) {
        local_file = localprefix + "/" + file;
        // If this file exists within the local Testing directory we assume
        // that it will be associated with the current build in CDash.
        initialize_cdash_buildid = true;
      }
      std::string remote_file =
        remoteprefix + cmSystemTools::GetFilenameName(file);

      *this->LogFile << "\tUpload file: " << local_file << " to "
                     << remote_file << std::endl;

      std::string ofile = cmSystemTools::EncodeURL(remote_file);
      std::string upload_as = url +
        ((url.find('?') == std::string::npos) ? '?' : '&') +
        "FileName=" + ofile;

      if (initialize_cdash_buildid) {
        // Provide extra arguments to CDash so that it can initialize and
        // return a buildid.
        cmCTestCurl ctest_curl(this->CTest);
        upload_as += "&build=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("BuildName"));
        upload_as += "&site=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("Site"));
        upload_as += "&stamp=";
        upload_as += ctest_curl.Escape(this->CTest->GetCurrentTag());
        upload_as += "-";
        upload_as += ctest_curl.Escape(this->CTest->GetTestModelString());
        cmCTestScriptHandler* ch = this->CTest->GetScriptHandler();
        cmake* cm = ch->GetCMake();
        if (cm) {
          const char* subproject =
            cm->GetState()->GetGlobalProperty("SubProject");
          if (subproject) {
            upload_as += "&subproject=";
            upload_as += ctest_curl.Escape(subproject);
          }
        }
      }

      upload_as += "&MD5=";

      if (cmSystemTools::IsOn(this->GetOption("InternalTest"))) {
        upload_as += "bad_md5sum";
      } else {
        upload_as +=
          cmSystemTools::ComputeFileHash(local_file, cmCryptoHash::AlgoMD5);
      }

      // Generate Done.xml right before it is submitted.
      // The reason for this is two-fold:
      // 1) It must be generated after some other part has been submitted
      //    so we have a buildId to refer to in its contents.
      // 2) By generating Done.xml here its timestamp will be as late as
      //    possible. This gives us a more accurate record of how long the
      //    entire build took to complete.
      if (file == "Done.xml") {
        this->CTest->GenerateDoneFile();
      }

      if (!cmSystemTools::FileExists(local_file)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Cannot find file: " << local_file << std::endl);
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      unsigned long filelen = cmSystemTools::FileLength(local_file);

      ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "   Upload file: " << local_file << " to "
                                            << upload_as << " Size: "
                                            << filelen << std::endl,
                         this->Quiet);

      // specify target
      ::curl_easy_setopt(curl, CURLOPT_URL, upload_as.c_str());

      // CURLAUTH_BASIC is default, and here we allow additional methods,
      // including more secure ones
      ::curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_ANY);

      // now specify which file to upload
      ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

      // and give the size of the upload (optional)
      ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(filelen));

      // and give curl the buffer for errors
      ::curl_easy_setopt(curl, CURLOPT_ERRORBUFFER, &error_buffer);

      // specify handler for output
      ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                         cmCTestSubmitHandlerWriteMemoryCallback);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                         cmCTestSubmitHandlerCurlDebugCallback);

      /* we pass our 'chunk' struct to the callback function */
      cmCTestSubmitHandlerVectorOfChar chunk;
      cmCTestSubmitHandlerVectorOfChar chunkDebug;
      ::curl_easy_setopt(curl, CURLOPT_FILE, &chunk);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);

      // Now run off and do what you've been told!
      res = ::curl_easy_perform(curl);

      if (!chunk.empty()) {
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "CURL output: ["
                             << cmCTestLogWrite(chunk.data(), chunk.size())
                             << "]" << std::endl,
                           this->Quiet);
        this->ParseResponse(chunk);
      }
      if (!chunkDebug.empty()) {
        cmCTestOptionalLog(
          this->CTest, DEBUG,
          "CURL debug output: ["
            << cmCTestLogWrite(chunkDebug.data(), chunkDebug.size()) << "]"
            << std::endl,
          this->Quiet);
      }

      // If curl failed for any reason, or checksum fails, wait and retry
      //
      if (res != CURLE_OK || this->HasErrors) {
        std::string retryDelay = this->GetOption("RetryDelay") == nullptr
          ? ""
          : this->GetOption("RetryDelay");
        std::string retryCount = this->GetOption("RetryCount") == nullptr
          ? ""
          : this->GetOption("RetryCount");

        auto delay = cmDuration(
          retryDelay.empty()
            ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryDelay")
                     .c_str())
            : atoi(retryDelay.c_str()));
        int count = retryCount.empty()
          ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryCount")
                   .c_str())
          : atoi(retryCount.c_str());

        for (int i = 0; i < count; i++) {
          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Submit failed, waiting " << delay.count()
                                                          << " seconds...\n",
                             this->Quiet);

          auto stop = std::chrono::steady_clock::now() + delay;
          while (std::chrono::steady_clock::now() < stop) {
            cmSystemTools::Delay(100);
          }

          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Retry submission: Attempt "
                               << (i + 1) << " of " << count << std::endl,
                             this->Quiet);

          ::fclose(ftpfile);
          ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
          ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

          chunk.clear();
          chunkDebug.clear();
          this->HasErrors = false;

          res = ::curl_easy_perform(curl);

          if (!chunk.empty()) {
            cmCTestOptionalLog(this->CTest, DEBUG,
                               "CURL output: ["
                                 << cmCTestLogWrite(chunk.data(), chunk.size())
                                 << "]" << std::endl,
                               this->Quiet);
            this->ParseResponse(chunk);
          }

          if (res == CURLE_OK && !this->HasErrors) {
            break;
          }
        }
      }

      fclose(ftpfile);
      if (res) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error when uploading file: " << local_file
                                                    << std::endl);
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error message was: " << error_buffer << std::endl);
        *this->LogFile << "   Error when uploading file: " << local_file
                       << std::endl
                       << "   Error message was: " << error_buffer
                       << std::endl;
        // avoid deref of begin for zero size array
        if (!chunk.empty()) {
          *this->LogFile << "   Curl output was: "
                         << cmCTestLogWrite(chunk.data(), chunk.size())
                         << std::endl;
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "CURL output: ["
                       << cmCTestLogWrite(chunk.data(), chunk.size()) << "]"
                       << std::endl);
        }
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      // always cleanup
      ::curl_easy_cleanup(curl);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Uploaded: " + local_file << std::endl,
                         this->Quiet);
    }
  }
  ::curl_slist_free_all(headers);
  ::curl_global_cleanup();
  return true;
}